

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.H
# Opt level: O2

void __thiscall Fl_Tree::open_toggle(Fl_Tree *this,Fl_Tree_Item *item,int docallback)

{
  if (item->_open != '\0') {
    close(this,(int)item);
    return;
  }
  if (item->_open == '\0') {
    Fl_Tree_Item::open(item,(char *)item,docallback);
    Fl_Widget::redraw((Fl_Widget *)this);
    if (docallback != 0) {
      do_callback_for_item(this,item,FL_TREE_REASON_OPENED);
    }
  }
  return;
}

Assistant:

int is_flag(unsigned short flag) const {
    switch (flag) {
      case     OPEN: return(_open ? 1 : 0);
      case  VISIBLE: return(_visible ? 1 : 0);
      case   ACTIVE: return(_active ? 1 : 0);
      case SELECTED: return(_selected ? 1 : 0);
      default:       return(0);
    }
  }